

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O2

future<dap::ResponseOrError<dap::LaunchResponse>_> __thiscall
dap::Session::send<dap::LaunchRequest,void>(Session *this,LaunchRequest *request)

{
  char cVar1;
  TypeInfo *pTVar2;
  TypeInfo *pTVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  future<dap::ResponseOrError<dap::LaunchResponse>_> fVar4;
  promise<dap::ResponseOrError<dap::LaunchResponse>_> promise;
  undefined1 local_88 [32];
  __shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  local_68;
  undefined1 local_58 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined8 uStack_38;
  
  std::make_shared<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>>>();
  pTVar2 = TypeOf<dap::LaunchRequest>::type();
  pTVar3 = TypeOf<dap::LaunchResponse>::type();
  std::
  __shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)local_88,&local_68);
  std::function<void(void_const*,dap::Error_const*)>::
  function<dap::Session::send<dap::LaunchRequest,void>(dap::LaunchRequest_const&)::_lambda(void_const*,dap::Error_const*)_1_,void>
            ((function<void(void_const*,dap::Error_const*)> *)local_58,
             (anon_class_16_1_70ebebfb *)local_88);
  cVar1 = (**(code **)((long)(request->restart).val.value.value + 0x50))(request,pTVar2,pTVar3);
  std::_Function_base::~_Function_base((_Function_base *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  if (cVar1 == '\0') {
    Error::Error((Error *)local_88,"Failed to send request");
    local_58._8_8_ = &stack0xffffffffffffffc0;
    if ((element_type *)local_88._0_8_ == (element_type *)(local_88 + 0x10)) {
      uStack_38 = local_88._24_8_;
    }
    else {
      local_58._8_8_ = local_88._0_8_;
    }
    local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
    local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88[0x10] = '\0';
    local_88._0_8_ = (element_type *)(local_88 + 0x10);
    promise<dap::ResponseOrError<dap::LaunchResponse>_>::set_value
              ((promise<dap::ResponseOrError<dap::LaunchResponse>_> *)&local_68,
               (ResponseOrError<dap::LaunchResponse> *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    std::__cxx11::string::~string((string *)local_88);
  }
  std::
  __shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)this,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  fVar4.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  fVar4.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (future<dap::ResponseOrError<dap::LaunchResponse>_>)
         fVar4.state.
         super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

future<ResponseOrError<typename T::Response>> Session::send(const T& request) {
  using Response = typename T::Response;
  promise<ResponseOrError<Response>> promise;
  auto sent = send(TypeOf<T>::type(), TypeOf<Response>::type(), &request,
                   [=](const void* result, const Error* error) {
                     if (error != nullptr) {
                       promise.set_value(ResponseOrError<Response>(*error));
                     } else {
                       promise.set_value(ResponseOrError<Response>(
                           *reinterpret_cast<const Response*>(result)));
                     }
                   });
  if (!sent) {
    promise.set_value(Error("Failed to send request"));
  }
  return promise.get_future();
}